

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_show_colormap.cxx
# Opt level: O2

void __thiscall ColorMenu::draw(ColorMenu *this)

{
  int c;
  Fl_Color c_00;
  
  if ((this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.damage_ == '\x01') {
    drawbox(this,this->previous);
    drawbox(this,this->which);
  }
  else {
    fl_draw_box(FL_UP_BOX,0,0,(this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.w_,
                (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.h_,
                (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.color_);
    for (c_00 = 0; c_00 != 0x100; c_00 = c_00 + 1) {
      drawbox(this,c_00);
    }
  }
  this->previous = this->which;
  return;
}

Assistant:

void ColorMenu::draw() {
  if (damage() != FL_DAMAGE_CHILD) {
    fl_draw_box(FL_UP_BOX,0,0,w(),h(),color());
    for (int c = 0; c < 256; c++) drawbox((Fl_Color)c);
  } else {
    drawbox(previous);
    drawbox(which);
  }
  previous = which;
}